

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O0

Vector2i sf::priv::InputImpl::getMousePosition(WindowBase *relativeTo)

{
  int y;
  int x;
  uint buttons;
  int gy;
  int gx;
  Window child;
  Window root;
  Display *display;
  WindowHandle handle;
  WindowBase *in_stack_ffffffffffffffa0;
  Display *in_stack_ffffffffffffffb0;
  int local_44;
  int local_40;
  undefined1 local_3c [4];
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  Display *local_20;
  WindowHandle local_18;
  Vector2i local_8;
  
  local_18 = WindowBase::getSystemHandle(in_stack_ffffffffffffffa0);
  if (local_18 == 0) {
    Vector2<int>::Vector2(&local_8);
  }
  else {
    local_20 = OpenDisplay();
    local_40 = 0;
    local_44 = 0;
    XQueryPointer(local_20,local_18,local_28,local_30,local_34,local_38,&local_40,&local_44,local_3c
                 );
    CloseDisplay(in_stack_ffffffffffffffb0);
    Vector2<int>::Vector2(&local_8,local_40,local_44);
  }
  return local_8;
}

Assistant:

Vector2i InputImpl::getMousePosition(const WindowBase& relativeTo)
{
    WindowHandle handle = relativeTo.getSystemHandle();
    if (handle)
    {
        // Open a connection with the X server
        Display* display = OpenDisplay();

        // we don't care about these but they are required
        ::Window root, child;
        int gx, gy;
        unsigned int buttons;

        int x = 0;
        int y = 0;
        XQueryPointer(display, handle, &root, &child, &gx, &gy, &x, &y, &buttons);

        // Close the connection with the X server
        CloseDisplay(display);

        return Vector2i(x, y);
    }
    else
    {
        return Vector2i();
    }
}